

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressbar.cpp
# Opt level: O2

void __thiscall QProgressBar::setValue(QProgressBar *this,int value)

{
  QProgressBarPrivate *this_00;
  bool bVar1;
  long in_FS_OFFSET;
  QAccessibleValueChangeEvent event;
  QVariant QStack_98;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QProgressBarPrivate **)&(this->super_QWidget).field_0x8;
  if ((this_00->value != value) &&
     (((value <= this_00->maximum && (*(int *)&(this_00->super_QWidgetPrivate).field_0x254 <= value)
       ) || ((this_00->maximum == 0 && (*(int *)&(this_00->super_QWidgetPrivate).field_0x254 == 0)))
      ))) {
    this_00->value = value;
    valueChanged(this,value);
    if ((((this->super_QWidget).data)->widget_attributes & 0x8000) != 0) {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
      ::QVariant::QVariant(&QStack_98,value);
      QAccessibleValueChangeEvent::QAccessibleValueChangeEvent
                ((QAccessibleValueChangeEvent *)&local_78,(QObject *)this,&QStack_98);
      ::QVariant::~QVariant(&QStack_98);
      QAccessible::updateAccessibility((QAccessibleEvent *)&local_78);
      QAccessibleValueChangeEvent::~QAccessibleValueChangeEvent
                ((QAccessibleValueChangeEvent *)&local_78);
    }
    bVar1 = QProgressBarPrivate::repaintRequired(this_00);
    if (bVar1) {
      QWidget::repaint(&this->super_QWidget);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QProgressBar::setValue(int value)
{
    Q_D(QProgressBar);
    if (d->value == value
            || ((value > d->maximum || value < d->minimum)
                && (d->maximum != 0 || d->minimum != 0)))
        return;
    d->value = value;
    emit valueChanged(value);
#if QT_CONFIG(accessibility)
    if (isVisible()) {
        QAccessibleValueChangeEvent event(this, value);
        QAccessible::updateAccessibility(&event);
    }
#endif
    if (d->repaintRequired())
        repaint();
}